

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

int64_t msa_madd_q_df(uint32_t df,int64_t dest,int64_t arg1,int64_t arg2)

{
  char cVar1;
  long lVar2;
  long local_58;
  long local_50;
  int64_t q_min;
  int64_t q_max;
  int64_t q_ret;
  int64_t q_prod;
  int64_t arg2_local;
  int64_t arg1_local;
  int64_t dest_local;
  uint32_t df_local;
  
  cVar1 = (char)df;
  lVar2 = (1L << ((char)(1L << (cVar1 + 3U & 0x3f)) - 1U & 0x3f)) + -1;
  local_50 = -(1L << ((char)(1L << (cVar1 + 3U & 0x3f)) - 1U & 0x3f));
  local_58 = (dest << ((char)(1L << (cVar1 + 3U & 0x3f)) - 1U & 0x3f)) + arg1 * arg2 >>
             ((char)(1L << (cVar1 + 3U & 0x3f)) - 1U & 0x3f);
  if (local_50 <= local_58) {
    if (lVar2 < local_58) {
      local_58 = lVar2;
    }
    local_50 = local_58;
  }
  return local_50;
}

Assistant:

static inline int64_t msa_madd_q_df(uint32_t df, int64_t dest, int64_t arg1,
                                    int64_t arg2)
{
    int64_t q_prod, q_ret;

    int64_t q_max = DF_MAX_INT(df);
    int64_t q_min = DF_MIN_INT(df);

    q_prod = arg1 * arg2;
    q_ret = ((dest << (DF_BITS(df) - 1)) + q_prod) >> (DF_BITS(df) - 1);

    return (q_ret < q_min) ? q_min : (q_max < q_ret) ? q_max : q_ret;
}